

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

bool pybind11::detail::deregister_instance_impl(void *ptr,instance *self)

{
  internals *piVar1;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar2;
  void *local_28;
  
  local_28 = ptr;
  piVar1 = get_internals();
  pVar2 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(piVar1->registered_instances)._M_h,&local_28);
  __it._M_cur = (__node_type *)
                pVar2.first.
                super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                ._M_cur;
  do {
    if (__it._M_cur ==
        (__node_type *)
        pVar2.second.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ._M_cur) {
LAB_00113126:
      return __it._M_cur !=
             (__node_type *)
             pVar2.second.
             super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
             ._M_cur;
    }
    if ((self->ob_base).ob_type == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
      std::
      _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
      ::erase(&(piVar1->registered_instances)._M_h,(const_iterator)__it._M_cur);
      goto LAB_00113126;
    }
    __it._M_cur = *__it._M_cur;
  } while( true );
}

Assistant:

inline bool deregister_instance_impl(void *ptr, instance *self) {
    auto &registered_instances = get_internals().registered_instances;
    auto range = registered_instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        if (Py_TYPE(self) == Py_TYPE(it->second)) {
            registered_instances.erase(it);
            return true;
        }
    }
    return false;
}